

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O0

void nn_node_term(nn_trie_node *self)

{
  nn_trie_node *in_RDI;
  int i;
  int children;
  uint local_14;
  uint index;
  
  if (in_RDI != (nn_trie_node *)0x0) {
    if (in_RDI->type < 9) {
      local_14 = (uint)in_RDI->type;
    }
    else {
      local_14 = ((uint)(in_RDI->u).sparse.children[1] - (uint)(in_RDI->u).sparse.children[0]) + 1;
    }
    for (index = 0; index != local_14; index = index + 1) {
      nn_node_child(in_RDI,index);
      nn_node_term((nn_trie_node *)CONCAT44(local_14,index));
    }
    nn_free((void *)0x1633a2);
  }
  return;
}

Assistant:

void nn_node_term (struct nn_trie_node *self)
{
    int children;
    int i;

    /*  Trivial case of the recursive algorithm. */
    if (!self)
        return;

    /*  Recursively destroy the child nodes. */
    children = self->type <= NN_TRIE_SPARSE_MAX ?
        self->type : (self->u.dense.max - self->u.dense.min + 1);
    for (i = 0; i != children; ++i)
        nn_node_term (*nn_node_child (self, i));

    /*  Deallocate this node. */
    nn_free (self);
}